

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O1

void __thiscall cmEventBasedConnection::ReadData(cmEventBasedConnection *this,string *data)

{
  string *psVar1;
  cmConnectionBufferStrategy *pcVar2;
  string packet;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  psVar1 = &this->RawReadBuffer;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)(data->_M_dataplus)._M_p);
  pcVar2 = (this->BufferStrategy)._M_t.
           super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
           .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl;
  if (pcVar2 == (cmConnectionBufferStrategy *)0x0) {
    (*(this->super_cmConnection)._vptr_cmConnection[6])(this,psVar1);
    (this->RawReadBuffer)._M_string_length = 0;
    *(this->RawReadBuffer)._M_dataplus._M_p = '\0';
  }
  else {
    (*pcVar2->_vptr_cmConnectionBufferStrategy[2])(&local_68,pcVar2,psVar1);
    do {
      (*(this->super_cmConnection)._vptr_cmConnection[6])(this,&local_68);
      pcVar2 = (this->BufferStrategy)._M_t.
               super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
               .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl;
      (*pcVar2->_vptr_cmConnectionBufferStrategy[2])((string *)local_48,pcVar2,psVar1);
      std::__cxx11::string::operator=((string *)&local_68,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    } while (local_60 != 0);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  return;
}

Assistant:

void cmEventBasedConnection::ReadData(const std::string& data)
{
  this->RawReadBuffer += data;
  if (BufferStrategy) {
    std::string packet = BufferStrategy->BufferMessage(this->RawReadBuffer);
    do {
      ProcessRequest(packet);
      packet = BufferStrategy->BufferMessage(this->RawReadBuffer);
    } while (!packet.empty());

  } else {
    ProcessRequest(this->RawReadBuffer);
    this->RawReadBuffer.clear();
  }
}